

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O0

void __thiscall Matrix::Matrix(Matrix *this,int i)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int *piVar3;
  allocator<char> local_15;
  int local_14;
  Matrix *pMStack_10;
  int i_local;
  Matrix *this_local;
  
  local_14 = i;
  pMStack_10 = this;
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Matrix_0018f6e8;
  boost::shared_array<double>::shared_array(&this->matrixParent);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->sMatrixName,"data",&local_15);
  std::allocator<char>::~allocator(&local_15);
  this->nMatrixDimension = 1;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->nMatrixDimension;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  piVar3 = (int *)operator_new__(uVar2);
  this->pSize = piVar3;
  *this->pSize = local_14;
  this->bReference = false;
  init(this,(EVP_PKEY_CTX *)0x1);
  return;
}

Assistant:

Matrix::Matrix(int i) : sMatrixName("data") 
 { 
	nMatrixDimension = 1;
	pSize = new int[nMatrixDimension];
	pSize[0] = i;
	bReference = false;
	init();
}